

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void add_damage(xchar x,xchar y,long cost)

{
  monst *pmVar1;
  damage *pdVar2;
  monst *mtmp;
  char *shops;
  damage *tmp_dam;
  long cost_local;
  xchar y_local;
  xchar x_local;
  
  if (level->locations[x][y].typ == '\x17') {
    mtmp = (monst *)in_rooms(level,x,y,0x12);
    while ((*(char *)&mtmp->nmon != '\0' &&
           (((pmVar1 = shop_keeper(level,*(char *)&mtmp->nmon), pmVar1 == (monst *)0x0 ||
             (x != (char)pmVar1[0x1b].mintrinsics)) ||
            (y != *(char *)((long)&pmVar1[0x1b].mintrinsics + 1)))))) {
      mtmp = (monst *)((long)&mtmp->nmon + 1);
    }
    if (*(char *)&mtmp->nmon == '\0') {
      return;
    }
  }
  shops = (char *)level->damagelist;
  while( true ) {
    if (shops == (char *)0x0) {
      pdVar2 = (damage *)malloc(0x20);
      pdVar2->when = (ulong)moves;
      (pdVar2->place).x = x;
      (pdVar2->place).y = y;
      pdVar2->cost = cost;
      pdVar2->typ = level->locations[x][y].typ;
      pdVar2->next = level->damagelist;
      level->damagelist = pdVar2;
      if ((viz_array[y][x] & 2U) != 0) {
        level->locations[x][y].seenv = 0xff;
      }
      return;
    }
    if ((shops[0x18] == x) && (shops[0x19] == y)) break;
    shops = *(char **)shops;
  }
  *(long *)(shops + 0x10) = cost + *(long *)(shops + 0x10);
  return;
}

Assistant:

void add_damage(xchar x, xchar y, long cost)
{
	struct damage *tmp_dam;
	char *shops;

	if (IS_DOOR(level->locations[x][y].typ)) {
	    struct monst *mtmp;

	    /* Don't schedule for repair unless it's a real shop entrance */
	    for (shops = in_rooms(level, x, y, SHOPBASE); *shops; shops++)
		if ((mtmp = shop_keeper(level, *shops)) != 0 &&
			x == ESHK(mtmp)->shd.x && y == ESHK(mtmp)->shd.y)
		    break;
	    if (!*shops) return;
	}
	for (tmp_dam = level->damagelist; tmp_dam; tmp_dam = tmp_dam->next)
	    if (tmp_dam->place.x == x && tmp_dam->place.y == y) {
		tmp_dam->cost += cost;
		return;
	    }
	tmp_dam = malloc((unsigned)sizeof(struct damage));
	tmp_dam->when = moves;
	tmp_dam->place.x = x;
	tmp_dam->place.y = y;
	tmp_dam->cost = cost;
	tmp_dam->typ = level->locations[x][y].typ;
	tmp_dam->next = level->damagelist;
	level->damagelist = tmp_dam;
	/* If player saw damage, display as a wall forever */
	if (cansee(x, y))
	    level->locations[x][y].seenv = SVALL;
}